

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::LayeredRenderCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ContextType *contextType)

{
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ContextType *local_20;
  ContextType *contextType_local;
  LayeredRenderCase *this_local;
  
  local_20 = contextType;
  contextType_local = (ContextType *)this;
  this_local = (LayeredRenderCase *)__return_storage_ptr__;
  if (*(int *)((long)this + 0x7c) == 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(((gl_Layer % 2) == 1) ? 1.0 : 0.5,\n\t                 (((gl_Layer / 2) % 2) == 1) ? 1.0 : 0.5,\n\t                 (gl_Layer == 0) ? 1.0 : 0.0,\n\t                 1.0);\n}\n"
               ,&local_79);
    anon_unknown_1::specializeShader(__return_storage_ptr__,&local_78,local_20);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
               ,&local_41);
    anon_unknown_1::specializeShader(__return_storage_ptr__,&local_40,local_20);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LayeredRenderCase::genFragmentSource (const glu::ContextType& contextType) const
{
	static const char* const fragmentLayerIdShader =	"${GLSL_VERSION_DECL}\n"
														"${GLSL_EXT_GEOMETRY_SHADER}"
														"layout(location = 0) out mediump vec4 fragColor;\n"
														"void main (void)\n"
														"{\n"
														"	fragColor = vec4(((gl_Layer % 2) == 1) ? 1.0 : 0.5,\n"
														"	                 (((gl_Layer / 2) % 2) == 1) ? 1.0 : 0.5,\n"
														"	                 (gl_Layer == 0) ? 1.0 : 0.0,\n"
														"	                 1.0);\n"
														"}\n";

	if (m_test != TEST_LAYER_ID)
		return specializeShader(s_commonShaderSourceFragment, contextType);
	else
		return specializeShader(fragmentLayerIdShader, contextType);
}